

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::update<QRect>(QWidgetPrivate *this,QRect r)

{
  uint uVar1;
  long lVar2;
  QWidget *this_00;
  long lVar3;
  QRect QVar4;
  QWidget *pQVar5;
  QUpdateLaterEvent *this_01;
  long in_FS_OFFSET;
  QRect local_50;
  QRect local_40;
  QRect r_local;
  
  QVar4._8_8_ = local_40._8_8_;
  QVar4._0_8_ = local_40._0_8_;
  r_local._8_8_ = r._8_8_;
  r_local._0_8_ = r._0_8_;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  uVar1 = this_00->data->widget_attributes;
  if (((*(uint *)&this->field_0x250 >> 0x18 & 1) == 0) || ((uVar1 & 0x8000) != 0)) {
    if ((uVar1 & 0x8400) == 0x8000) {
      local_50 = QWidget::rect(this_00);
      local_40 = (QRect)QRect::operator&(&r_local,&local_50);
      if ((local_40.x1.m_i.m_i <= local_40.x2.m_i.m_i) &&
         (local_40.y1.m_i.m_i <= local_40.y2.m_i.m_i)) {
        if ((*(byte *)(*(long *)&this_00->field_0x8 + 0x243) & 0x40) == 0) {
          pQVar5 = QWidget::window(this_00);
          lVar3 = *(long *)(*(long *)&pQVar5->field_0x8 + 0x78);
          if ((((lVar3 != 0) && (lVar3 = *(long *)(lVar3 + 8), lVar3 != 0)) &&
              (*(long *)(lVar3 + 0x10) != 0)) &&
             (*(QWidgetRepaintManager **)(lVar3 + 8) != (QWidgetRepaintManager *)0x0)) {
            QWidgetRepaintManager::markDirty<QRect>
                      (*(QWidgetRepaintManager **)(lVar3 + 8),&local_40,this_00,UpdateLater,
                       BufferValid);
          }
        }
        else {
          this_01 = (QUpdateLaterEvent *)operator_new(0x18);
          QRegion::QRegion((QRegion *)&local_50,&local_40,Rectangle);
          QUpdateLaterEvent::QUpdateLaterEvent(this_01,(QRegion *)&local_50);
          QCoreApplication::postEvent(&this_00->super_QObject,(QEvent *)this_01,0);
          QRegion::~QRegion((QRegion *)&local_50);
        }
      }
    }
  }
  else {
    *(uint *)&this->field_0x250 = *(uint *)&this->field_0x250 | 0x8000000;
    local_40 = QVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::update(T r)
{
    Q_Q(QWidget);

    if (renderToTexture && !q->isVisible()) {
        renderToTextureReallyDirty = 1;
        return;
    }

    if (!q->isVisible() || !q->updatesEnabled())
        return;

    T clipped = r & q->rect();

    if (clipped.isEmpty())
        return;

    if (q->testAttribute(Qt::WA_WState_InPaintEvent)) {
        QCoreApplication::postEvent(q, new QUpdateLaterEvent(clipped));
        return;
    }

    QTLWExtra *tlwExtra = q->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore && tlwExtra->repaintManager)
        tlwExtra->repaintManager->markDirty(clipped, q);
}